

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O0

void __thiscall
cmExtraKateGenerator::CreateDummyKateProjectFile(cmExtraKateGenerator *this,cmLocalGenerator *lg)

{
  byte bVar1;
  char *pcVar2;
  ostream *poVar3;
  string *psVar4;
  undefined1 local_298 [8];
  cmGeneratedFileStream fout;
  allocator local_39;
  string local_38 [8];
  string filename;
  cmLocalGenerator *lg_local;
  cmExtraKateGenerator *this_local;
  
  filename.field_2._8_8_ = lg;
  pcVar2 = cmLocalGenerator::GetBinaryDirectory(lg);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,pcVar2,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::__cxx11::string::operator+=(local_38,"/");
  std::__cxx11::string::operator+=(local_38,(string *)&this->ProjectName);
  std::__cxx11::string::operator+=(local_38,".kateproject");
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_298,pcVar2,false);
  bVar1 = std::ios::operator!((ios *)(local_298 + (long)*(_func_int **)((long)local_298 + -0x18)));
  if ((bVar1 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)local_298,"#Generated by ");
    psVar4 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    poVar3 = std::operator<<(poVar3,(string *)psVar4);
    std::operator<<(poVar3,", do not edit.\n");
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void
cmExtraKateGenerator::CreateDummyKateProjectFile(
    const cmLocalGenerator* lg) const
{
  std::string filename = lg->GetBinaryDirectory();
  filename += "/";
  filename += this->ProjectName;
  filename += ".kateproject";
  cmGeneratedFileStream fout(filename.c_str());
  if (!fout)
    {
    return;
    }

  fout << "#Generated by " << cmSystemTools::GetCMakeCommand()
       << ", do not edit.\n";
}